

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
mjs::object::debug_print(object *this,wostream *os,int indent_incr,int max_nest,int indent)

{
  uint32_t uVar1;
  bool bVar2;
  wchar_t indent_00;
  wostream *pwVar3;
  gc_vector<mjs::object::property> *this_00;
  gc_heap *h;
  int iVar4;
  undefined4 in_register_0000000c;
  int iVar5;
  wstring_view __x;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  undefined1 local_c0 [40];
  value local_98;
  ulong local_70;
  gc_heap *local_68;
  gc_heap_ptr_untyped local_60;
  wstring indent_string;
  
  if ((max_nest < 1) || (4 < indent / indent_incr)) {
    pwVar3 = std::operator<<(os,"[Object ");
    class_name((object *)local_c0);
    pwVar3 = mjs::operator<<(pwVar3,(string *)local_c0);
    std::operator<<(pwVar3,"]");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
  }
  else {
    indent_00 = indent_incr + indent;
    indent_string._M_dataplus._M_p = (pointer)&indent_string.field_2;
    std::__cxx11::wstring::_M_construct((ulong)&indent_string,indent_00);
    std::operator<<(os,"{\n");
    class_name((object *)&local_98);
    pwVar3 = std::operator<<(os,(wstring *)&indent_string);
    pwVar3 = std::operator<<(pwVar3,"[[Class]]");
    std::operator<<(pwVar3,": ");
    value::value((value *)local_c0,(string *)&local_98);
    iVar5 = max_nest + -1;
    iVar4 = iVar5;
    if (1 < (uint)max_nest) {
      iVar4 = 1;
    }
    mjs::debug_print(os,(value *)local_c0,indent_incr,iVar4,indent_00);
    value::~value((value *)local_c0);
    std::operator<<(os,"\n");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_98);
    uVar1 = (this->prototype_).pos_;
    if (uVar1 == 0) {
      value::value(&local_98,(value *)value::null);
    }
    else {
      gc_heap_ptr_untracked<mjs::object,_true>::track
                ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_60,(gc_heap *)&this->prototype_)
      ;
      value::value(&local_98,(object_ptr *)&local_60);
    }
    pwVar3 = std::operator<<(os,(wstring *)&indent_string);
    pwVar3 = std::operator<<(pwVar3,"[[Prototype]]");
    std::operator<<(pwVar3,": ");
    value::value((value *)local_c0,&local_98);
    mjs::debug_print(os,(value *)local_c0,indent_incr,iVar4,indent_00);
    value::~value((value *)local_c0);
    std::operator<<(os,"\n");
    value::~value(&local_98);
    if (uVar1 != 0) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
    }
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                        (&this->properties_,this->heap_);
    h = (gc_heap *)gc_vector<mjs::object::property>::tab(this_00);
    local_70 = (ulong)(uint)indent;
    local_68 = (gc_heap *)gc_vector<mjs::object::property>::end(this_00);
    while (h = (gc_heap *)&h->alloc_context_, h != local_68) {
      property::key((property *)local_c0,h);
      __x = string::view((string *)local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
      property::get(&local_98,(property *)h,this);
      __y._M_str = L"constructor";
      __y._M_len = 0xb;
      bVar2 = std::operator==(__x,__y);
      pwVar3 = std::operator<<(os,(wstring *)&indent_string);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar3,__x._M_str,__x._M_len);
      std::operator<<(pwVar3,": ");
      value::value((value *)local_c0,&local_98);
      iVar4 = iVar5;
      if (bVar2) {
        iVar4 = 1;
      }
      if ((uint)max_nest < 2) {
        iVar4 = iVar5;
      }
      mjs::debug_print(os,(value *)local_c0,indent_incr,iVar4,indent_00);
      value::~value((value *)local_c0);
      std::operator<<(os,"\n");
      value::~value(&local_98);
    }
    (*this->_vptr_object[8])
              (this,os,(ulong)(uint)indent_incr,CONCAT44(in_register_0000000c,max_nest),
               (ulong)(uint)indent_00);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::wstring::_M_construct((ulong)local_c0,(wchar_t)local_70);
    pwVar3 = std::operator<<(os,(wstring *)local_c0);
    std::operator<<(pwVar3,"}");
    std::__cxx11::wstring::~wstring((wstring *)local_c0);
    std::__cxx11::wstring::~wstring((wstring *)&indent_string);
  }
  return;
}

Assistant:

void object::debug_print(std::wostream& os, int indent_incr, int max_nest, int indent) const {
    if (indent / indent_incr > 4 || max_nest <= 0) {
        os << "[Object " << class_name() << "]";
        return;
    }
    auto indent_string = std::wstring(indent + indent_incr, ' ');
    auto print_prop = [&](const auto& name, const auto& val, bool internal) {
        os << indent_string << name << ": ";
        mjs::debug_print(os, mjs::value{val}, indent_incr, max_nest > 1 && internal ? 1 : max_nest - 1, indent + indent_incr);
        os << "\n";
    };
    os << "{\n";
    print_prop("[[Class]]", class_name(), true);
    print_prop("[[Prototype]]", prototype_ ? value{prototype_.track(heap())} : value::null, true);
    for (auto& p: properties_.dereference(heap_)) {
        const auto key = p.key(heap_).view();
        print_prop(key, p.get(*this), key == L"constructor");
    }
    do_debug_print_extra(os, indent_incr, max_nest, indent+indent_incr);
    os << std::wstring(indent, ' ') << "}";
}